

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor_test.cpp
# Opt level: O3

void __thiscall WrongMode::test_method(WrongMode *this)

{
  string local_118;
  undefined1 local_f8 [8];
  undefined1 local_f0 [32];
  string local_d0 [2];
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2b);
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"WRONG","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Huffman","");
  local_d0[0]._M_dataplus._M_p = (pointer)&local_d0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Test message","");
  Cryptor::cryptor_factory((Cryptor *)local_f8,(string *)local_f0,&local_118,local_d0);
  if (local_f8 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_f8 + 8))();
  }
  local_f8 = (undefined1  [8])0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0[0]._M_dataplus._M_p != &local_d0[0].field_2) {
    operator_delete(local_d0[0]._M_dataplus._M_p,local_d0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x2b);
  local_118._M_dataplus._M_p = local_118._M_dataplus._M_p & 0xffffffffffffff00;
  local_118._M_string_length = 0;
  local_118.field_2._M_allocated_capacity = 0;
  local_f0[8] = 0;
  local_f0._0_8_ = &PTR__lazy_ostream_0010faa0;
  local_f0._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_f0._24_8_ = "exception std::runtime_error expected but not raised";
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
  ;
  local_78 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_118.field_2._M_allocated_capacity);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WrongMode) {

  BOOST_CHECK_THROW(Cryptor::cryptor_factory(
    "WRONG",
    "Huffman",
    "Test message"
  ), std::runtime_error);
}